

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderProgram.cpp
# Opt level: O2

TestLog * glu::operator<<(TestLog *log,ProgramSources *sources)

{
  qpShaderType type;
  pointer pbVar1;
  TestLog *pTVar2;
  size_t in_RCX;
  size_t __n;
  long lVar3;
  void *__buf;
  void *__buf_00;
  ulong uVar4;
  allocator<char> local_c1;
  TestLog *local_c0;
  long local_b8;
  ProgramSources *local_b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_a8;
  string local_a0;
  undefined1 local_80 [80];
  
  local_c0 = log;
  local_b0 = sources;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"(Source only)",&local_c1);
  local_80[0] = false;
  std::__cxx11::string::string((string *)(local_80 + 8),(string *)&local_a0);
  tcu::LogShaderProgram::write((LogShaderProgram *)local_80,(int)local_c0,__buf,in_RCX);
  std::__cxx11::string::~string((string *)(local_80 + 8));
  std::__cxx11::string::~string((string *)&local_a0);
  for (lVar3 = 0; pTVar2 = local_c0, lVar3 != 6; lVar3 = lVar3 + 1) {
    local_a8 = local_b0->sources + lVar3;
    local_b8 = 0;
    for (uVar4 = 0;
        pbVar1 = (local_a8->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start,
        uVar4 < (ulong)((long)(local_a8->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5);
        uVar4 = uVar4 + 1) {
      type = getLogShaderType::s_typeMap[lVar3];
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"",&local_c1);
      __n = 0;
      tcu::LogShader::LogShader
                ((LogShader *)local_80,type,(string *)((long)&(pbVar1->_M_dataplus)._M_p + local_b8)
                 ,false,&local_a0);
      tcu::LogShader::write((LogShader *)local_80,(int)local_c0,__buf_00,__n);
      tcu::LogShader::~LogShader((LogShader *)local_80);
      std::__cxx11::string::~string((string *)&local_a0);
      local_b8 = local_b8 + 0x20;
    }
  }
  tcu::TestLog::endShaderProgram(local_c0);
  return pTVar2;
}

Assistant:

tcu::TestLog& operator<< (tcu::TestLog& log, const ProgramSources& sources)
{
	log << tcu::TestLog::ShaderProgram(false, "(Source only)");

	try
	{
		for (int shaderType = 0; shaderType < SHADERTYPE_LAST; shaderType++)
		{
			for (size_t shaderNdx = 0; shaderNdx < sources.sources[shaderType].size(); shaderNdx++)
			{
				log << tcu::TestLog::Shader(getLogShaderType((ShaderType)shaderType),
											sources.sources[shaderType][shaderNdx],
											false, "");
			}
		}
	}
	catch (...)
	{
		log << tcu::TestLog::EndShaderProgram;
		throw;
	}

	log << tcu::TestLog::EndShaderProgram;

	return log;
}